

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_size_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1a78ba::ByteSizeTest_PopulatedMsg_Test::~ByteSizeTest_PopulatedMsg_Test
          (ByteSizeTest_PopulatedMsg_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteSizeTest, PopulatedMsg) {
  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_int32(msg, 322);
  auto res = upb_ByteSize(UPB_UPCAST(msg), kTestMiniTable);
  EXPECT_EQ(res, 3);
  upb_Arena_Free(arena);
}